

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O1

void fillAes1Rx4<true>(void *state,size_t outputSize,void *buffer)

{
  longlong in_RCX;
  void *pvVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 alVar20;
  
  uVar16 = *state;
  uVar17 = *(undefined4 *)((long)state + 4);
  uVar18 = *(undefined4 *)((long)state + 8);
  uVar19 = *(undefined4 *)((long)state + 0xc);
  uVar12 = *(undefined4 *)((long)state + 0x10);
  uVar13 = *(undefined4 *)((long)state + 0x14);
  uVar14 = *(undefined4 *)((long)state + 0x18);
  uVar15 = *(undefined4 *)((long)state + 0x1c);
  uVar8 = *(undefined4 *)((long)state + 0x20);
  uVar9 = *(undefined4 *)((long)state + 0x24);
  uVar10 = *(undefined4 *)((long)state + 0x28);
  uVar11 = *(undefined4 *)((long)state + 0x2c);
  uVar4 = *(undefined4 *)((long)state + 0x30);
  uVar5 = *(undefined4 *)((long)state + 0x34);
  uVar6 = *(undefined4 *)((long)state + 0x38);
  uVar7 = *(undefined4 *)((long)state + 0x3c);
  if (0 < (long)outputSize) {
    puVar3 = (undefined4 *)(outputSize + (long)buffer);
    pvVar1 = state;
    puVar2 = (undefined4 *)buffer;
    do {
      alVar20[1] = outputSize;
      alVar20[0] = (longlong)pvVar1;
      key[1] = in_RCX;
      key[0] = (longlong)buffer;
      alVar20 = soft_aesdec(alVar20,key);
      key_00[0] = alVar20[1];
      in[1] = outputSize;
      in[0] = (longlong)pvVar1;
      key_00[1] = in_RCX;
      alVar20 = soft_aesenc(in,key_00);
      key_01[0] = alVar20[1];
      in_00[1] = outputSize;
      in_00[0] = (longlong)pvVar1;
      key_01[1] = in_RCX;
      alVar20 = soft_aesdec(in_00,key_01);
      key_02[0] = alVar20[1];
      in_01[1] = outputSize;
      in_01[0] = (longlong)pvVar1;
      key_02[1] = in_RCX;
      alVar20 = soft_aesenc(in_01,key_02);
      buffer = alVar20[1];
      *puVar2 = extraout_XMM0_Da;
      puVar2[1] = extraout_XMM0_Db;
      puVar2[2] = extraout_XMM0_Dc;
      puVar2[3] = extraout_XMM0_Dd;
      puVar2[4] = extraout_XMM0_Da_00;
      puVar2[5] = extraout_XMM0_Db_00;
      puVar2[6] = extraout_XMM0_Dc_00;
      puVar2[7] = extraout_XMM0_Dd_00;
      puVar2[8] = extraout_XMM0_Da_01;
      puVar2[9] = extraout_XMM0_Db_01;
      puVar2[10] = extraout_XMM0_Dc_01;
      puVar2[0xb] = extraout_XMM0_Dd_01;
      puVar2[0xc] = extraout_XMM0_Da_02;
      puVar2[0xd] = extraout_XMM0_Db_02;
      puVar2[0xe] = extraout_XMM0_Dc_02;
      puVar2[0xf] = extraout_XMM0_Dd_02;
      puVar2 = puVar2 + 0x10;
      uVar4 = extraout_XMM0_Da_02;
      uVar5 = extraout_XMM0_Db_02;
      uVar6 = extraout_XMM0_Dc_02;
      uVar7 = extraout_XMM0_Dd_02;
      uVar8 = extraout_XMM0_Da_01;
      uVar9 = extraout_XMM0_Db_01;
      uVar10 = extraout_XMM0_Dc_01;
      uVar11 = extraout_XMM0_Dd_01;
      uVar12 = extraout_XMM0_Da_00;
      uVar13 = extraout_XMM0_Db_00;
      uVar14 = extraout_XMM0_Dc_00;
      uVar15 = extraout_XMM0_Dd_00;
      uVar16 = extraout_XMM0_Da;
      uVar17 = extraout_XMM0_Db;
      uVar18 = extraout_XMM0_Dc;
      uVar19 = extraout_XMM0_Dd;
    } while (puVar2 < puVar3);
  }
  *(undefined4 *)state = uVar16;
  *(undefined4 *)((long)state + 4) = uVar17;
  *(undefined4 *)((long)state + 8) = uVar18;
  *(undefined4 *)((long)state + 0xc) = uVar19;
  *(undefined4 *)((long)state + 0x10) = uVar12;
  *(undefined4 *)((long)state + 0x14) = uVar13;
  *(undefined4 *)((long)state + 0x18) = uVar14;
  *(undefined4 *)((long)state + 0x1c) = uVar15;
  *(undefined4 *)((long)state + 0x20) = uVar8;
  *(undefined4 *)((long)state + 0x24) = uVar9;
  *(undefined4 *)((long)state + 0x28) = uVar10;
  *(undefined4 *)((long)state + 0x2c) = uVar11;
  *(undefined4 *)((long)state + 0x30) = uVar4;
  *(undefined4 *)((long)state + 0x34) = uVar5;
  *(undefined4 *)((long)state + 0x38) = uVar6;
  *(undefined4 *)((long)state + 0x3c) = uVar7;
  return;
}

Assistant:

void fillAes1Rx4(void *state, size_t outputSize, void *buffer) {
	assert(outputSize % 64 == 0);
	const uint8_t* outptr = (uint8_t*)buffer;
	const uint8_t* outputEnd = outptr + outputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 key0, key1, key2, key3;

	key0 = rx_set_int_vec_i128(AES_GEN_1R_KEY0);
	key1 = rx_set_int_vec_i128(AES_GEN_1R_KEY1);
	key2 = rx_set_int_vec_i128(AES_GEN_1R_KEY2);
	key3 = rx_set_int_vec_i128(AES_GEN_1R_KEY3);

	state0 = rx_load_vec_i128((rx_vec_i128*)state + 0);
	state1 = rx_load_vec_i128((rx_vec_i128*)state + 1);
	state2 = rx_load_vec_i128((rx_vec_i128*)state + 2);
	state3 = rx_load_vec_i128((rx_vec_i128*)state + 3);

	while (outptr < outputEnd) {
		state0 = aesdec<softAes>(state0, key0);
		state1 = aesenc<softAes>(state1, key1);
		state2 = aesdec<softAes>(state2, key2);
		state3 = aesenc<softAes>(state3, key3);

		rx_store_vec_i128((rx_vec_i128*)outptr + 0, state0);
		rx_store_vec_i128((rx_vec_i128*)outptr + 1, state1);
		rx_store_vec_i128((rx_vec_i128*)outptr + 2, state2);
		rx_store_vec_i128((rx_vec_i128*)outptr + 3, state3);

		outptr += 64;
	}

	rx_store_vec_i128((rx_vec_i128*)state + 0, state0);
	rx_store_vec_i128((rx_vec_i128*)state + 1, state1);
	rx_store_vec_i128((rx_vec_i128*)state + 2, state2);
	rx_store_vec_i128((rx_vec_i128*)state + 3, state3);
}